

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_sse_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  ulong uVar122;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  byte bVar130;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  long lVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  
  auVar140 = _DAT_00116070;
  auVar139 = _DAT_00116060;
  uVar122 = (ulong)(len >> 3);
  if (len < 0x40) {
    uVar133 = 0;
  }
  else {
    uVar132 = 0;
    uVar131 = 8;
    do {
      uVar133 = uVar131;
      lVar134 = 0x20;
      auVar143 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8),auVar139,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 8));
      auVar144 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 8),auVar140,
                                   *(undefined1 (*) [16])(array + uVar132 * 8));
      auVar141 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 0x10),auVar139,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 0x18));
      auVar142 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 0x18),auVar140,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 0x10));
      auVar135 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 0x20),auVar139,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 0x28));
      auVar136 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 0x28),auVar140,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 0x20));
      auVar137 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 0x30),auVar139,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 0x38));
      auVar138 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar132 * 8 + 0x38),auVar140,
                                   *(undefined1 (*) [16])(array + uVar132 * 8 + 0x30));
      do {
        auVar2 = auVar141 >> 7;
        auVar10 = auVar141 >> 0xf;
        auVar18 = auVar141 >> 0x17;
        auVar34 = auVar141 >> 0x1f;
        auVar58 = auVar141 >> 0x27;
        auVar82 = auVar141 >> 0x2f;
        auVar106 = auVar141 >> 0x37;
        auVar26 = auVar141 >> 0x3f;
        auVar38 = auVar141 >> 0x47;
        auVar50 = auVar141 >> 0x4f;
        auVar62 = auVar141 >> 0x57;
        auVar74 = auVar141 >> 0x5f;
        auVar86 = auVar141 >> 0x67;
        auVar98 = auVar141 >> 0x6f;
        auVar110 = auVar141 >> 0x77;
        bVar123 = auVar141[0xf];
        auVar3 = auVar135 >> 7;
        auVar11 = auVar135 >> 0xf;
        auVar19 = auVar135 >> 0x17;
        auVar35 = auVar135 >> 0x1f;
        auVar59 = auVar135 >> 0x27;
        auVar83 = auVar135 >> 0x2f;
        auVar107 = auVar135 >> 0x37;
        auVar27 = auVar135 >> 0x3f;
        auVar39 = auVar135 >> 0x47;
        auVar51 = auVar135 >> 0x4f;
        auVar63 = auVar135 >> 0x57;
        auVar75 = auVar135 >> 0x5f;
        auVar87 = auVar135 >> 0x67;
        auVar99 = auVar135 >> 0x6f;
        auVar111 = auVar135 >> 0x77;
        bVar124 = auVar135[0xf];
        auVar4 = auVar143 >> 7;
        auVar12 = auVar143 >> 0xf;
        auVar20 = auVar143 >> 0x17;
        auVar36 = auVar143 >> 0x1f;
        auVar60 = auVar143 >> 0x27;
        auVar84 = auVar143 >> 0x2f;
        auVar108 = auVar143 >> 0x37;
        auVar28 = auVar143 >> 0x3f;
        auVar40 = auVar143 >> 0x47;
        auVar52 = auVar143 >> 0x4f;
        auVar64 = auVar143 >> 0x57;
        auVar76 = auVar143 >> 0x5f;
        auVar88 = auVar143 >> 0x67;
        auVar100 = auVar143 >> 0x6f;
        auVar112 = auVar143 >> 0x77;
        bVar125 = auVar143[0xf];
        auVar5 = auVar142 >> 7;
        auVar13 = auVar142 >> 0xf;
        auVar21 = auVar142 >> 0x17;
        auVar37 = auVar142 >> 0x1f;
        auVar61 = auVar142 >> 0x27;
        auVar85 = auVar142 >> 0x2f;
        auVar109 = auVar142 >> 0x37;
        auVar29 = auVar142 >> 0x3f;
        auVar41 = auVar142 >> 0x47;
        auVar53 = auVar142 >> 0x4f;
        auVar65 = auVar142 >> 0x57;
        auVar77 = auVar142 >> 0x5f;
        auVar89 = auVar142 >> 0x67;
        auVar101 = auVar142 >> 0x6f;
        auVar113 = auVar142 >> 0x77;
        bVar126 = auVar142[0xf];
        auVar6 = auVar144 >> 7;
        auVar14 = auVar144 >> 0xf;
        auVar22 = auVar144 >> 0x17;
        auVar46 = auVar144 >> 0x1f;
        auVar70 = auVar144 >> 0x27;
        auVar94 = auVar144 >> 0x2f;
        auVar118 = auVar144 >> 0x37;
        auVar30 = auVar144 >> 0x3f;
        auVar42 = auVar144 >> 0x47;
        auVar54 = auVar144 >> 0x4f;
        auVar66 = auVar144 >> 0x57;
        auVar78 = auVar144 >> 0x5f;
        auVar90 = auVar144 >> 0x67;
        auVar102 = auVar144 >> 0x6f;
        auVar114 = auVar144 >> 0x77;
        bVar127 = auVar144[0xf];
        auVar143 = vpaddb_avx(auVar143,auVar143);
        auVar144 = vpaddb_avx(auVar144,auVar144);
        auVar141 = vpaddb_avx(auVar141,auVar141);
        auVar142 = vpaddb_avx(auVar142,auVar142);
        auVar135 = vpaddb_avx(auVar135,auVar135);
        auVar7 = auVar136 >> 7;
        auVar15 = auVar136 >> 0xf;
        auVar23 = auVar136 >> 0x17;
        auVar47 = auVar136 >> 0x1f;
        auVar71 = auVar136 >> 0x27;
        auVar95 = auVar136 >> 0x2f;
        auVar119 = auVar136 >> 0x37;
        auVar31 = auVar136 >> 0x3f;
        auVar43 = auVar136 >> 0x47;
        auVar55 = auVar136 >> 0x4f;
        auVar67 = auVar136 >> 0x57;
        auVar79 = auVar136 >> 0x5f;
        auVar91 = auVar136 >> 0x67;
        auVar103 = auVar136 >> 0x6f;
        auVar115 = auVar136 >> 0x77;
        bVar128 = auVar136[0xf];
        auVar136 = vpaddb_avx(auVar136,auVar136);
        auVar8 = auVar137 >> 7;
        auVar16 = auVar137 >> 0xf;
        auVar24 = auVar137 >> 0x17;
        auVar48 = auVar137 >> 0x1f;
        auVar72 = auVar137 >> 0x27;
        auVar96 = auVar137 >> 0x2f;
        auVar120 = auVar137 >> 0x37;
        auVar32 = auVar137 >> 0x3f;
        auVar44 = auVar137 >> 0x47;
        auVar56 = auVar137 >> 0x4f;
        auVar68 = auVar137 >> 0x57;
        auVar80 = auVar137 >> 0x5f;
        auVar92 = auVar137 >> 0x67;
        auVar104 = auVar137 >> 0x6f;
        auVar116 = auVar137 >> 0x77;
        bVar129 = auVar137[0xf];
        auVar137 = vpaddb_avx(auVar137,auVar137);
        auVar9 = auVar138 >> 7;
        auVar17 = auVar138 >> 0xf;
        auVar25 = auVar138 >> 0x17;
        auVar49 = auVar138 >> 0x1f;
        auVar73 = auVar138 >> 0x27;
        auVar97 = auVar138 >> 0x2f;
        auVar121 = auVar138 >> 0x37;
        auVar33 = auVar138 >> 0x3f;
        auVar45 = auVar138 >> 0x47;
        auVar57 = auVar138 >> 0x4f;
        auVar69 = auVar138 >> 0x57;
        auVar81 = auVar138 >> 0x5f;
        auVar93 = auVar138 >> 0x67;
        auVar105 = auVar138 >> 0x6f;
        auVar117 = auVar138 >> 0x77;
        bVar130 = auVar138[0xf];
        auVar138 = vpaddb_avx(auVar138,auVar138);
        *(int *)((long)flags + lVar134 + -4) =
             POPCOUNT((uint)(ushort)((ushort)(auVar8[0] & 1) | (ushort)(auVar16[0] & 1) << 1 |
                                     (ushort)(auVar24[0] & 1) << 2 | (ushort)(auVar48[0] & 1) << 3 |
                                     (ushort)(auVar72[0] & 1) << 4 | (ushort)(auVar96[0] & 1) << 5 |
                                     (ushort)(auVar120[0] & 1) << 6 | (ushort)(auVar32[0] & 1) << 7
                                     | (ushort)(auVar44[0] & 1) << 8 | (ushort)(auVar56[0] & 1) << 9
                                     | (ushort)(auVar68[0] & 1) << 10 |
                                     (ushort)(auVar80[0] & 1) << 0xb |
                                     (ushort)(auVar92[0] & 1) << 0xc |
                                     (ushort)(auVar104[0] & 1) << 0xd |
                                     (ushort)(auVar116[0] & 1) << 0xe |
                                    (ushort)(bVar129 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar3[0] & 1) | (ushort)(auVar11[0] & 1) << 1 |
                                     (ushort)(auVar19[0] & 1) << 2 | (ushort)(auVar35[0] & 1) << 3 |
                                     (ushort)(auVar59[0] & 1) << 4 | (ushort)(auVar83[0] & 1) << 5 |
                                     (ushort)(auVar107[0] & 1) << 6 | (ushort)(auVar27[0] & 1) << 7
                                     | (ushort)(auVar39[0] & 1) << 8 | (ushort)(auVar51[0] & 1) << 9
                                     | (ushort)(auVar63[0] & 1) << 10 |
                                     (ushort)(auVar75[0] & 1) << 0xb |
                                     (ushort)(auVar87[0] & 1) << 0xc |
                                     (ushort)(auVar99[0] & 1) << 0xd |
                                     (ushort)(auVar111[0] & 1) << 0xe |
                                    (ushort)(bVar124 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar2[0] & 1) | (ushort)(auVar10[0] & 1) << 1 |
                                     (ushort)(auVar18[0] & 1) << 2 | (ushort)(auVar34[0] & 1) << 3 |
                                     (ushort)(auVar58[0] & 1) << 4 | (ushort)(auVar82[0] & 1) << 5 |
                                     (ushort)(auVar106[0] & 1) << 6 | (ushort)(auVar26[0] & 1) << 7
                                     | (ushort)(auVar38[0] & 1) << 8 | (ushort)(auVar50[0] & 1) << 9
                                     | (ushort)(auVar62[0] & 1) << 10 |
                                     (ushort)(auVar74[0] & 1) << 0xb |
                                     (ushort)(auVar86[0] & 1) << 0xc |
                                     (ushort)(auVar98[0] & 1) << 0xd |
                                     (ushort)(auVar110[0] & 1) << 0xe |
                                    (ushort)(bVar123 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar4[0] & 1) | (ushort)(auVar12[0] & 1) << 1 |
                                     (ushort)(auVar20[0] & 1) << 2 | (ushort)(auVar36[0] & 1) << 3 |
                                     (ushort)(auVar60[0] & 1) << 4 | (ushort)(auVar84[0] & 1) << 5 |
                                     (ushort)(auVar108[0] & 1) << 6 | (ushort)(auVar28[0] & 1) << 7
                                     | (ushort)(auVar40[0] & 1) << 8 | (ushort)(auVar52[0] & 1) << 9
                                     | (ushort)(auVar64[0] & 1) << 10 |
                                     (ushort)(auVar76[0] & 1) << 0xb |
                                     (ushort)(auVar88[0] & 1) << 0xc |
                                     (ushort)(auVar100[0] & 1) << 0xd |
                                     (ushort)(auVar112[0] & 1) << 0xe |
                                    (ushort)(bVar125 >> 7) << 0xf)) +
             *(int *)((long)flags + lVar134 + -4);
        *(int *)((long)flags + lVar134 + 0x1c) =
             POPCOUNT((uint)(ushort)((ushort)(auVar9[0] & 1) | (ushort)(auVar17[0] & 1) << 1 |
                                     (ushort)(auVar25[0] & 1) << 2 | (ushort)(auVar49[0] & 1) << 3 |
                                     (ushort)(auVar73[0] & 1) << 4 | (ushort)(auVar97[0] & 1) << 5 |
                                     (ushort)(auVar121[0] & 1) << 6 | (ushort)(auVar33[0] & 1) << 7
                                     | (ushort)(auVar45[0] & 1) << 8 | (ushort)(auVar57[0] & 1) << 9
                                     | (ushort)(auVar69[0] & 1) << 10 |
                                     (ushort)(auVar81[0] & 1) << 0xb |
                                     (ushort)(auVar93[0] & 1) << 0xc |
                                     (ushort)(auVar105[0] & 1) << 0xd |
                                     (ushort)(auVar117[0] & 1) << 0xe |
                                    (ushort)(bVar130 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar7[0] & 1) | (ushort)(auVar15[0] & 1) << 1 |
                                     (ushort)(auVar23[0] & 1) << 2 | (ushort)(auVar47[0] & 1) << 3 |
                                     (ushort)(auVar71[0] & 1) << 4 | (ushort)(auVar95[0] & 1) << 5 |
                                     (ushort)(auVar119[0] & 1) << 6 | (ushort)(auVar31[0] & 1) << 7
                                     | (ushort)(auVar43[0] & 1) << 8 | (ushort)(auVar55[0] & 1) << 9
                                     | (ushort)(auVar67[0] & 1) << 10 |
                                     (ushort)(auVar79[0] & 1) << 0xb |
                                     (ushort)(auVar91[0] & 1) << 0xc |
                                     (ushort)(auVar103[0] & 1) << 0xd |
                                     (ushort)(auVar115[0] & 1) << 0xe |
                                    (ushort)(bVar128 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar5[0] & 1) | (ushort)(auVar13[0] & 1) << 1 |
                                     (ushort)(auVar21[0] & 1) << 2 | (ushort)(auVar37[0] & 1) << 3 |
                                     (ushort)(auVar61[0] & 1) << 4 | (ushort)(auVar85[0] & 1) << 5 |
                                     (ushort)(auVar109[0] & 1) << 6 | (ushort)(auVar29[0] & 1) << 7
                                     | (ushort)(auVar41[0] & 1) << 8 | (ushort)(auVar53[0] & 1) << 9
                                     | (ushort)(auVar65[0] & 1) << 10 |
                                     (ushort)(auVar77[0] & 1) << 0xb |
                                     (ushort)(auVar89[0] & 1) << 0xc |
                                     (ushort)(auVar101[0] & 1) << 0xd |
                                     (ushort)(auVar113[0] & 1) << 0xe |
                                    (ushort)(bVar126 >> 7) << 0xf)) +
             POPCOUNT((uint)(ushort)((ushort)(auVar6[0] & 1) | (ushort)(auVar14[0] & 1) << 1 |
                                     (ushort)(auVar22[0] & 1) << 2 | (ushort)(auVar46[0] & 1) << 3 |
                                     (ushort)(auVar70[0] & 1) << 4 | (ushort)(auVar94[0] & 1) << 5 |
                                     (ushort)(auVar118[0] & 1) << 6 | (ushort)(auVar30[0] & 1) << 7
                                     | (ushort)(auVar42[0] & 1) << 8 | (ushort)(auVar54[0] & 1) << 9
                                     | (ushort)(auVar66[0] & 1) << 10 |
                                     (ushort)(auVar78[0] & 1) << 0xb |
                                     (ushort)(auVar90[0] & 1) << 0xc |
                                     (ushort)(auVar102[0] & 1) << 0xd |
                                     (ushort)(auVar114[0] & 1) << 0xe |
                                    (ushort)(bVar127 >> 7) << 0xf)) +
             *(int *)((long)flags + lVar134 + 0x1c);
        lVar134 = lVar134 + -4;
      } while (lVar134 != 0);
      uVar132 = uVar133;
      uVar131 = uVar133 + 8;
    } while (uVar133 + 8 <= uVar122);
  }
  auVar144 = _DAT_00116070;
  auVar143 = _DAT_00116060;
  uVar132 = uVar133 | 4;
  auVar139 = _DAT_00116060;
  auVar140 = _DAT_00116070;
  while (uVar131 = uVar132, _DAT_00116060 = auVar139, _DAT_00116070 = auVar140, uVar131 <= uVar122)
  {
    lVar134 = 0x20;
    auVar139 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar133 * 8),auVar143,
                                 *(undefined1 (*) [16])(array + uVar133 * 8 + 8));
    auVar140 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar133 * 8 + 8),auVar144,
                                 *(undefined1 (*) [16])(array + uVar133 * 8));
    auVar141 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar133 * 8 + 0x10),auVar143,
                                 *(undefined1 (*) [16])(array + uVar133 * 8 + 0x18));
    auVar142 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar133 * 8 + 0x18),auVar144,
                                 *(undefined1 (*) [16])(array + uVar133 * 8 + 0x10));
    do {
      auVar135 = auVar139 >> 7;
      auVar2 = auVar139 >> 0xf;
      auVar6 = auVar139 >> 0x17;
      auVar10 = auVar139 >> 0x1f;
      auVar14 = auVar139 >> 0x27;
      auVar18 = auVar139 >> 0x2f;
      auVar22 = auVar139 >> 0x37;
      auVar34 = auVar139 >> 0x3f;
      auVar46 = auVar139 >> 0x47;
      auVar58 = auVar139 >> 0x4f;
      auVar70 = auVar139 >> 0x57;
      auVar82 = auVar139 >> 0x5f;
      auVar94 = auVar139 >> 0x67;
      auVar106 = auVar139 >> 0x6f;
      auVar118 = auVar139 >> 0x77;
      bVar123 = auVar139[0xf];
      auVar136 = auVar140 >> 7;
      auVar3 = auVar140 >> 0xf;
      auVar7 = auVar140 >> 0x17;
      auVar11 = auVar140 >> 0x1f;
      auVar15 = auVar140 >> 0x27;
      auVar19 = auVar140 >> 0x2f;
      auVar23 = auVar140 >> 0x37;
      auVar35 = auVar140 >> 0x3f;
      auVar47 = auVar140 >> 0x47;
      auVar59 = auVar140 >> 0x4f;
      auVar71 = auVar140 >> 0x57;
      auVar83 = auVar140 >> 0x5f;
      auVar95 = auVar140 >> 0x67;
      auVar107 = auVar140 >> 0x6f;
      auVar119 = auVar140 >> 0x77;
      bVar124 = auVar140[0xf];
      auVar137 = auVar141 >> 7;
      auVar4 = auVar141 >> 0xf;
      auVar8 = auVar141 >> 0x17;
      auVar12 = auVar141 >> 0x1f;
      auVar16 = auVar141 >> 0x27;
      auVar20 = auVar141 >> 0x2f;
      auVar24 = auVar141 >> 0x37;
      auVar36 = auVar141 >> 0x3f;
      auVar48 = auVar141 >> 0x47;
      auVar60 = auVar141 >> 0x4f;
      auVar72 = auVar141 >> 0x57;
      auVar84 = auVar141 >> 0x5f;
      auVar96 = auVar141 >> 0x67;
      auVar108 = auVar141 >> 0x6f;
      auVar120 = auVar141 >> 0x77;
      bVar125 = auVar141[0xf];
      auVar139 = vpaddb_avx(auVar139,auVar139);
      auVar140 = vpaddb_avx(auVar140,auVar140);
      auVar141 = vpaddb_avx(auVar141,auVar141);
      auVar138 = auVar142 >> 7;
      auVar5 = auVar142 >> 0xf;
      auVar9 = auVar142 >> 0x17;
      auVar13 = auVar142 >> 0x1f;
      auVar17 = auVar142 >> 0x27;
      auVar21 = auVar142 >> 0x2f;
      auVar25 = auVar142 >> 0x37;
      auVar37 = auVar142 >> 0x3f;
      auVar49 = auVar142 >> 0x47;
      auVar61 = auVar142 >> 0x4f;
      auVar73 = auVar142 >> 0x57;
      auVar85 = auVar142 >> 0x5f;
      auVar97 = auVar142 >> 0x67;
      auVar109 = auVar142 >> 0x6f;
      auVar121 = auVar142 >> 0x77;
      bVar126 = auVar142[0xf];
      auVar142 = vpaddb_avx(auVar142,auVar142);
      *(int *)((long)flags + lVar134 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar137[0] & 1) | (ushort)(auVar4[0] & 1) << 1 |
                                   (ushort)(auVar8[0] & 1) << 2 | (ushort)(auVar12[0] & 1) << 3 |
                                   (ushort)(auVar16[0] & 1) << 4 | (ushort)(auVar20[0] & 1) << 5 |
                                   (ushort)(auVar24[0] & 1) << 6 | (ushort)(auVar36[0] & 1) << 7 |
                                   (ushort)(auVar48[0] & 1) << 8 | (ushort)(auVar60[0] & 1) << 9 |
                                   (ushort)(auVar72[0] & 1) << 10 | (ushort)(auVar84[0] & 1) << 0xb
                                   | (ushort)(auVar96[0] & 1) << 0xc |
                                   (ushort)(auVar108[0] & 1) << 0xd |
                                   (ushort)(auVar120[0] & 1) << 0xe | (ushort)(bVar125 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar135[0] & 1) | (ushort)(auVar2[0] & 1) << 1 |
                                   (ushort)(auVar6[0] & 1) << 2 | (ushort)(auVar10[0] & 1) << 3 |
                                   (ushort)(auVar14[0] & 1) << 4 | (ushort)(auVar18[0] & 1) << 5 |
                                   (ushort)(auVar22[0] & 1) << 6 | (ushort)(auVar34[0] & 1) << 7 |
                                   (ushort)(auVar46[0] & 1) << 8 | (ushort)(auVar58[0] & 1) << 9 |
                                   (ushort)(auVar70[0] & 1) << 10 | (ushort)(auVar82[0] & 1) << 0xb
                                   | (ushort)(auVar94[0] & 1) << 0xc |
                                   (ushort)(auVar106[0] & 1) << 0xd |
                                   (ushort)(auVar118[0] & 1) << 0xe | (ushort)(bVar123 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar134 + -4);
      *(int *)((long)flags + lVar134 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar138[0] & 1) | (ushort)(auVar5[0] & 1) << 1 |
                                   (ushort)(auVar9[0] & 1) << 2 | (ushort)(auVar13[0] & 1) << 3 |
                                   (ushort)(auVar17[0] & 1) << 4 | (ushort)(auVar21[0] & 1) << 5 |
                                   (ushort)(auVar25[0] & 1) << 6 | (ushort)(auVar37[0] & 1) << 7 |
                                   (ushort)(auVar49[0] & 1) << 8 | (ushort)(auVar61[0] & 1) << 9 |
                                   (ushort)(auVar73[0] & 1) << 10 | (ushort)(auVar85[0] & 1) << 0xb
                                   | (ushort)(auVar97[0] & 1) << 0xc |
                                   (ushort)(auVar109[0] & 1) << 0xd |
                                   (ushort)(auVar121[0] & 1) << 0xe | (ushort)(bVar126 >> 7) << 0xf)
                   ) +
           POPCOUNT((uint)(ushort)((ushort)(auVar136[0] & 1) | (ushort)(auVar3[0] & 1) << 1 |
                                   (ushort)(auVar7[0] & 1) << 2 | (ushort)(auVar11[0] & 1) << 3 |
                                   (ushort)(auVar15[0] & 1) << 4 | (ushort)(auVar19[0] & 1) << 5 |
                                   (ushort)(auVar23[0] & 1) << 6 | (ushort)(auVar35[0] & 1) << 7 |
                                   (ushort)(auVar47[0] & 1) << 8 | (ushort)(auVar59[0] & 1) << 9 |
                                   (ushort)(auVar71[0] & 1) << 10 | (ushort)(auVar83[0] & 1) << 0xb
                                   | (ushort)(auVar95[0] & 1) << 0xc |
                                   (ushort)(auVar107[0] & 1) << 0xd |
                                   (ushort)(auVar119[0] & 1) << 0xe | (ushort)(bVar124 >> 7) << 0xf)
                   ) + *(int *)((long)flags + lVar134 + 0x1c);
      lVar134 = lVar134 + -4;
    } while (lVar134 != 0);
    uVar133 = uVar131;
    auVar139 = _DAT_00116060;
    auVar140 = _DAT_00116070;
    uVar132 = uVar131 + 4;
  }
  while (uVar132 = uVar133 + 2, uVar132 <= uVar122) {
    lVar134 = 0x20;
    auVar143 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar133 * 8),auVar139,
                                 *(undefined1 (*) [16])(array + uVar133 * 8 + 8));
    auVar144 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar133 * 8 + 8),auVar140,
                                 *(undefined1 (*) [16])(array + uVar133 * 8));
    do {
      auVar141 = auVar143 >> 7;
      auVar142 = auVar143 >> 0xf;
      auVar135 = auVar143 >> 0x17;
      auVar136 = auVar143 >> 0x1f;
      auVar137 = auVar143 >> 0x27;
      auVar138 = auVar143 >> 0x2f;
      auVar2 = auVar143 >> 0x37;
      auVar3 = auVar143 >> 0x3f;
      auVar4 = auVar143 >> 0x47;
      auVar5 = auVar143 >> 0x4f;
      auVar6 = auVar143 >> 0x57;
      auVar7 = auVar143 >> 0x5f;
      auVar8 = auVar143 >> 0x67;
      auVar9 = auVar143 >> 0x6f;
      auVar10 = auVar143 >> 0x77;
      bVar123 = auVar143[0xf];
      auVar143 = vpaddb_avx(auVar143,auVar143);
      piVar1 = (int *)((long)flags + lVar134 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(auVar141[0] & 1) |
                                                  (ushort)(auVar142[0] & 1) << 1 |
                                                  (ushort)(auVar135[0] & 1) << 2 |
                                                  (ushort)(auVar136[0] & 1) << 3 |
                                                  (ushort)(auVar137[0] & 1) << 4 |
                                                  (ushort)(auVar138[0] & 1) << 5 |
                                                  (ushort)(auVar2[0] & 1) << 6 |
                                                  (ushort)(auVar3[0] & 1) << 7 |
                                                  (ushort)(auVar4[0] & 1) << 8 |
                                                  (ushort)(auVar5[0] & 1) << 9 |
                                                  (ushort)(auVar6[0] & 1) << 10 |
                                                  (ushort)(auVar7[0] & 1) << 0xb |
                                                  (ushort)(auVar8[0] & 1) << 0xc |
                                                  (ushort)(auVar9[0] & 1) << 0xd |
                                                  (ushort)(auVar10[0] & 1) << 0xe |
                                                 (ushort)(bVar123 >> 7) << 0xf));
      auVar141 = auVar144 >> 7;
      auVar142 = auVar144 >> 0xf;
      auVar135 = auVar144 >> 0x17;
      auVar136 = auVar144 >> 0x1f;
      auVar137 = auVar144 >> 0x27;
      auVar138 = auVar144 >> 0x2f;
      auVar2 = auVar144 >> 0x37;
      auVar3 = auVar144 >> 0x3f;
      auVar4 = auVar144 >> 0x47;
      auVar5 = auVar144 >> 0x4f;
      auVar6 = auVar144 >> 0x57;
      auVar7 = auVar144 >> 0x5f;
      auVar8 = auVar144 >> 0x67;
      auVar9 = auVar144 >> 0x6f;
      auVar10 = auVar144 >> 0x77;
      bVar123 = auVar144[0xf];
      auVar144 = vpaddb_avx(auVar144,auVar144);
      piVar1 = (int *)((long)flags + lVar134 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(ushort)((ushort)(auVar141[0] & 1) |
                                                  (ushort)(auVar142[0] & 1) << 1 |
                                                  (ushort)(auVar135[0] & 1) << 2 |
                                                  (ushort)(auVar136[0] & 1) << 3 |
                                                  (ushort)(auVar137[0] & 1) << 4 |
                                                  (ushort)(auVar138[0] & 1) << 5 |
                                                  (ushort)(auVar2[0] & 1) << 6 |
                                                  (ushort)(auVar3[0] & 1) << 7 |
                                                  (ushort)(auVar4[0] & 1) << 8 |
                                                  (ushort)(auVar5[0] & 1) << 9 |
                                                  (ushort)(auVar6[0] & 1) << 10 |
                                                  (ushort)(auVar7[0] & 1) << 0xb |
                                                  (ushort)(auVar8[0] & 1) << 0xc |
                                                  (ushort)(auVar9[0] & 1) << 0xd |
                                                  (ushort)(auVar10[0] & 1) << 0xe |
                                                 (ushort)(bVar123 >> 7) << 0xf));
      lVar134 = lVar134 + -4;
      uVar133 = uVar132;
    } while (lVar134 != 0);
  }
  uVar133 = uVar133 << 3;
  if (uVar133 < len) {
    auVar145 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar146 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar147 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar133 = uVar133 + 1;
      auVar148 = vpbroadcastd_avx512f();
      auVar148 = vpsrlvd_avx512f(auVar148,auVar146);
      auVar148 = vpandd_avx512f(auVar148,auVar147);
      auVar145 = vpaddd_avx512f(auVar148,auVar145);
    } while (len != uVar133);
    auVar145 = vmovdqu64_avx512f(auVar145);
    *(undefined1 (*) [64])flags = auVar145;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m128i v##p = _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3) U(4,5) U(6,7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4,5) A(6, 7)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}